

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

void absl::lts_20250127::synchronization_internal::Sort
               (Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>
                *nodes,Vec<int> *delta)

{
  uint uVar1;
  int *__first;
  ulong uVar2;
  int *__i;
  int *__last;
  long lVar3;
  
  uVar1 = delta->size_;
  uVar2 = (ulong)uVar1;
  if (uVar2 != 0) {
    __first = delta->ptr_;
    lVar3 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar1 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_comp_iter<absl::lts_20250127::synchronization_internal::Sort(absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node*>const&,absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Vec<int>*)::ByRank>>
              (__first,__first + uVar2,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<ByRank>)nodes);
    if (uVar1 < 0x11) {
      std::
      __insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<absl::lts_20250127::synchronization_internal::Sort(absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node*>const&,absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Vec<int>*)::ByRank>>
                (__first,__first + uVar2,(_Iter_comp_iter<ByRank>)nodes);
      return;
    }
    __last = __first + 0x10;
    std::
    __insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<absl::lts_20250127::synchronization_internal::Sort(absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node*>const&,absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Vec<int>*)::ByRank>>
              (__first,__last,(_Iter_comp_iter<ByRank>)nodes);
    for (lVar3 = uVar2 * 4 + -0x40; lVar3 != 0; lVar3 = lVar3 + -4) {
      std::
      __unguarded_linear_insert<int*,__gnu_cxx::__ops::_Val_comp_iter<absl::lts_20250127::synchronization_internal::Sort(absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node*>const&,absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Vec<int>*)::ByRank>>
                (__last,(_Val_comp_iter<ByRank>)nodes);
      __last = __last + 1;
    }
  }
  return;
}

Assistant:

T* end() { return ptr_ + size_; }